

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O3

void AccumulateRGB(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int step,int rgb_stride,
                  uint16_t *dst,int width)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  iVar4 = width >> 1;
  if (iVar4 < 1) {
    uVar3 = 0;
  }
  else {
    lVar6 = (long)(rgb_stride + step);
    uVar3 = 0;
    do {
      uVar1 = (uint)kGammaToLinearTab[r_ptr[uVar3 + lVar6]] +
              (uint)kGammaToLinearTab[r_ptr[uVar3 + (long)rgb_stride]] +
              (uint)kGammaToLinearTab[r_ptr[uVar3 + (uint)step]] +
              (uint)kGammaToLinearTab[r_ptr[uVar3]];
      uVar5 = uVar1 & 0x1ff;
      uVar2 = (ulong)(uVar1 >> 9);
      *dst = (uint16_t)
             (uVar5 * kLinearToGammaTab[uVar2 + 1] + (0x200 - uVar5) * kLinearToGammaTab[uVar2] +
              0x40 >> 7);
      uVar5 = (uint)kGammaToLinearTab[g_ptr[uVar3 + lVar6]] +
              (uint)kGammaToLinearTab[g_ptr[uVar3 + (long)rgb_stride]] +
              (uint)kGammaToLinearTab[g_ptr[uVar3 + (uint)step]] +
              (uint)kGammaToLinearTab[g_ptr[uVar3]];
      uVar1 = uVar5 & 0x1ff;
      uVar2 = (ulong)(uVar5 >> 9);
      dst[1] = (uint16_t)
               ((0x200 - uVar1) * kLinearToGammaTab[uVar2] + uVar1 * kLinearToGammaTab[uVar2 + 1] +
                0x40 >> 7);
      uVar5 = (uint)kGammaToLinearTab[b_ptr[uVar3 + lVar6]] +
              (uint)kGammaToLinearTab[b_ptr[uVar3 + (long)rgb_stride]] +
              (uint)kGammaToLinearTab[b_ptr[uVar3 + (uint)step]] +
              (uint)kGammaToLinearTab[b_ptr[uVar3]];
      uVar1 = uVar5 & 0x1ff;
      uVar2 = (ulong)(uVar5 >> 9);
      dst[2] = (uint16_t)
               ((0x200 - uVar1) * kLinearToGammaTab[uVar2] + uVar1 * kLinearToGammaTab[uVar2 + 1] +
                0x40 >> 7);
      uVar3 = uVar3 + (uint)(step * 2);
      dst = dst + 4;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    uVar3 = uVar3 & 0xffffffff;
  }
  if ((width & 1U) != 0) {
    uVar1 = (uint)kGammaToLinearTab[r_ptr[(long)rgb_stride + uVar3]] +
            (uint)kGammaToLinearTab[r_ptr[uVar3]] & 0xff;
    uVar2 = (ulong)((uint)kGammaToLinearTab[r_ptr[(long)rgb_stride + uVar3]] +
                    (uint)kGammaToLinearTab[r_ptr[uVar3]] >> 8);
    *dst = (uint16_t)
           (kLinearToGammaTab[uVar2 + 1] * uVar1 * 2 +
            (uVar1 * -2 + 0x200) * kLinearToGammaTab[uVar2] + 0x40 >> 7);
    uVar1 = (uint)kGammaToLinearTab[g_ptr[(long)rgb_stride + uVar3]] +
            (uint)kGammaToLinearTab[g_ptr[uVar3]] & 0xff;
    uVar2 = (ulong)((uint)kGammaToLinearTab[g_ptr[(long)rgb_stride + uVar3]] +
                    (uint)kGammaToLinearTab[g_ptr[uVar3]] >> 8);
    dst[1] = (uint16_t)
             (uVar1 * 2 * kLinearToGammaTab[uVar2 + 1] +
              (uVar1 * -2 + 0x200) * kLinearToGammaTab[uVar2] + 0x40 >> 7);
    uVar1 = (uint)kGammaToLinearTab[b_ptr[(long)rgb_stride + uVar3]] +
            (uint)kGammaToLinearTab[b_ptr[uVar3]] & 0xff;
    uVar3 = (ulong)((uint)kGammaToLinearTab[b_ptr[(long)rgb_stride + uVar3]] +
                    (uint)kGammaToLinearTab[b_ptr[uVar3]] >> 8);
    dst[2] = (uint16_t)
             (uVar1 * 2 * kLinearToGammaTab[uVar3 + 1] +
              (uVar1 * -2 + 0x200) * kLinearToGammaTab[uVar3] + 0x40 >> 7);
  }
  return;
}

Assistant:

static WEBP_INLINE void AccumulateRGB(const uint8_t* const r_ptr,
                                      const uint8_t* const g_ptr,
                                      const uint8_t* const b_ptr,
                                      int step, int rgb_stride,
                                      uint16_t* dst, int width) {
  int i, j;
  for (i = 0, j = 0; i < (width >> 1); i += 1, j += 2 * step, dst += 4) {
    dst[0] = SUM4(r_ptr + j, step);
    dst[1] = SUM4(g_ptr + j, step);
    dst[2] = SUM4(b_ptr + j, step);
    // MemorySanitizer may raise false positives with data that passes through
    // RGBA32PackedToPlanar_16b_SSE41() due to incorrect modeling of shuffles.
    // See https://crbug.com/webp/573.
#ifdef WEBP_MSAN
    dst[3] = 0;
#endif
  }
  if (width & 1) {
    dst[0] = SUM2(r_ptr + j);
    dst[1] = SUM2(g_ptr + j);
    dst[2] = SUM2(b_ptr + j);
#ifdef WEBP_MSAN
    dst[3] = 0;
#endif
  }
}